

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O2

_Bool av1_compute_global_motion_feature_match
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,int downsample_level,MotionModel *motion_models,int num_motion_models,
                _Bool *mem_alloc_failed)

{
  int iVar1;
  int iVar2;
  ImagePyramid *pyr;
  CornerList *corners;
  ImagePyramid *pyr_00;
  CornerList *corners_00;
  PyramidLayer *pPVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  int iVar7;
  Correspondence *matched_points;
  void *memblk;
  void *memblk_00;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int j;
  ulong uVar15;
  ulong uVar16;
  int *piVar17;
  uint uVar18;
  ulong uVar19;
  double *pdVar20;
  double dVar21;
  double local_48;
  double u;
  MotionModel *local_38;
  
  pyr = src->y_pyramid;
  corners = src->corners;
  pyr_00 = ref->y_pyramid;
  corners_00 = ref->corners;
  local_38 = motion_models;
  iVar7 = aom_compute_pyramid(src,bit_depth,1,pyr);
  if ((((-1 < iVar7) &&
       (_Var6 = av1_compute_corner_list(src,bit_depth,downsample_level,corners), _Var6)) &&
      (iVar7 = aom_compute_pyramid(ref,bit_depth,1,pyr_00), -1 < iVar7)) &&
     (_Var6 = av1_compute_corner_list(src,bit_depth,downsample_level,corners_00), _Var6)) {
    pPVar3 = pyr->layers;
    puVar4 = pPVar3->buffer;
    iVar7 = pPVar3->width;
    iVar1 = pPVar3->height;
    iVar2 = pPVar3->stride;
    pPVar3 = pyr_00->layers;
    puVar5 = pPVar3->buffer;
    iVar10 = pPVar3->stride;
    matched_points = (Correspondence *)aom_malloc((long)corners->num_corners << 5);
    if (matched_points != (Correspondence *)0x0) {
      uVar18 = corners->num_corners;
      uVar9 = corners_00->num_corners;
      memblk = aom_calloc((long)(int)uVar18,0x28);
      if ((memblk == (void *)0x0) ||
         (memblk_00 = aom_calloc((long)(int)uVar9,0x28), memblk_00 == (void *)0x0)) {
        iVar10 = 0;
        memblk_00 = (void *)0x0;
      }
      else {
        uVar16 = 0;
        uVar14 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar14 = uVar16;
        }
        uVar18 = 0;
        for (; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          iVar13 = corners->corners[uVar16 * 2];
          if (((6 < iVar13) && (iVar11 = corners->corners[uVar16 * 2 + 1], 6 < iVar11)) &&
             ((iVar13 + 7 < iVar7 && (iVar11 + 7 < iVar1)))) {
            lVar8 = (long)(int)uVar18 * 0x28;
            *(int *)((long)memblk + lVar8) = iVar13;
            *(int *)((long)memblk + lVar8 + 4) = iVar11;
            *(undefined8 *)((long)memblk + lVar8 + 0x20) = 0x3fe8000000000000;
            _Var6 = (*aom_compute_mean_stddev)
                              (puVar4,iVar2,iVar13,iVar11,(double *)((long)memblk + lVar8 + 8),
                               (double *)((long)memblk + lVar8 + 0x10));
            uVar18 = uVar18 + _Var6;
          }
        }
        if (uVar18 == 0) {
          iVar10 = 0;
        }
        else {
          uVar16 = 0;
          uVar14 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar14 = uVar16;
          }
          uVar9 = 0;
          for (; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            iVar13 = corners_00->corners[uVar16 * 2];
            if ((((6 < iVar13) && (iVar11 = corners_00->corners[uVar16 * 2 + 1], 6 < iVar11)) &&
                (iVar13 + 7 < iVar7)) && (iVar11 + 7 < iVar1)) {
              lVar8 = (long)(int)uVar9 * 0x28;
              *(int *)((long)memblk_00 + lVar8) = iVar13;
              *(int *)((long)memblk_00 + lVar8 + 4) = iVar11;
              *(undefined8 *)((long)memblk_00 + lVar8 + 0x20) = 0x3fe8000000000000;
              _Var6 = (*aom_compute_mean_stddev)
                                (puVar5,iVar10,iVar13,iVar11,(double *)((long)memblk_00 + lVar8 + 8)
                                 ,(double *)((long)memblk_00 + lVar8 + 0x10));
              uVar9 = uVar9 + _Var6;
            }
          }
          if (uVar9 == 0) {
            iVar10 = 0;
          }
          else {
            iVar13 = iVar1;
            if (iVar1 < iVar7) {
              iVar13 = iVar7;
            }
            uVar16 = 0;
            uVar14 = (ulong)uVar9;
            if ((int)uVar9 < 1) {
              uVar14 = uVar16;
            }
            uVar19 = (ulong)uVar18;
            if ((int)uVar18 < 1) {
              uVar19 = uVar16;
            }
            for (; uVar16 != uVar19; uVar16 = uVar16 + 1) {
              piVar17 = (int *)(uVar16 * 0x28 + (long)memblk);
              pdVar20 = (double *)((long)memblk_00 + 0x20);
              for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
                iVar11 = *piVar17 - *(int *)(pdVar20 + -4);
                iVar12 = piVar17[1] - *(int *)((long)pdVar20 + -0x1c);
                if ((uint)(iVar12 * iVar12 + iVar11 * iVar11) <=
                    (uint)((iVar13 >> 4) * (iVar13 >> 4))) {
                  dVar21 = (*aom_compute_correlation)
                                     (puVar4,iVar2,*piVar17,piVar17[1],*(double *)(piVar17 + 2),
                                      *(double *)(piVar17 + 4),puVar5,iVar10,*(int *)(pdVar20 + -4),
                                      *(int *)((long)pdVar20 + -0x1c),pdVar20[-3],pdVar20[-2]);
                  if (*(double *)(piVar17 + 8) <= dVar21 && dVar21 != *(double *)(piVar17 + 8)) {
                    piVar17[6] = (int)uVar15;
                    *(double *)(piVar17 + 8) = dVar21;
                  }
                  if (*pdVar20 <= dVar21 && dVar21 != *pdVar20) {
                    *(int *)(pdVar20 + -1) = (int)uVar16;
                    *pdVar20 = dVar21;
                  }
                }
                pdVar20 = pdVar20 + 5;
              }
            }
            pdVar20 = (double *)((long)memblk + 0x20);
            iVar10 = 0;
            for (uVar14 = 0; uVar19 != uVar14; uVar14 = uVar14 + 1) {
              if ((0.75 < *pdVar20 || *pdVar20 == 0.75) &&
                 (uVar14 == *(uint *)((long)memblk_00 + (long)*(int *)(pdVar20 + -1) * 0x28 + 0x18))
                 ) {
                piVar17 = (int *)((long)*(int *)(pdVar20 + -1) * 0x28 + (long)memblk_00);
                iVar13 = *(int *)(pdVar20 + -4);
                iVar11 = *(int *)((long)pdVar20 + -0x1c);
                u = (double)(*piVar17 - iVar13);
                local_48 = (double)(piVar17[1] - iVar11);
                (*aom_compute_flow_at_point)
                          (puVar4,puVar5,iVar13 + -3,iVar11 + -3,iVar7,iVar1,iVar2,&u,&local_48);
                matched_points[iVar10].x = (double)iVar13;
                matched_points[iVar10].y = (double)iVar11;
                matched_points[iVar10].rx = (double)iVar13 + u;
                matched_points[iVar10].ry = (double)iVar11 + local_48;
                iVar10 = iVar10 + 1;
              }
              pdVar20 = pdVar20 + 5;
            }
          }
        }
      }
      aom_free(memblk);
      aom_free(memblk_00);
      _Var6 = ransac(matched_points,iVar10,type,local_38,num_motion_models,mem_alloc_failed);
      aom_free(matched_points);
      return _Var6;
    }
  }
  *mem_alloc_failed = true;
  return false;
}

Assistant:

bool av1_compute_global_motion_feature_match(
    TransformationType type, YV12_BUFFER_CONFIG *src, YV12_BUFFER_CONFIG *ref,
    int bit_depth, int downsample_level, MotionModel *motion_models,
    int num_motion_models, bool *mem_alloc_failed) {
  int num_correspondences;
  Correspondence *correspondences;
  ImagePyramid *src_pyramid = src->y_pyramid;
  CornerList *src_corners = src->corners;
  ImagePyramid *ref_pyramid = ref->y_pyramid;
  CornerList *ref_corners = ref->corners;

  // Precompute information we will need about each frame
  if (aom_compute_pyramid(src, bit_depth, 1, src_pyramid) < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, src_corners)) {
    *mem_alloc_failed = true;
    return false;
  }
  if (aom_compute_pyramid(ref, bit_depth, 1, ref_pyramid) < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, ref_corners)) {
    *mem_alloc_failed = true;
    return false;
  }

  const uint8_t *src_buffer = src_pyramid->layers[0].buffer;
  const int src_width = src_pyramid->layers[0].width;
  const int src_height = src_pyramid->layers[0].height;
  const int src_stride = src_pyramid->layers[0].stride;

  const uint8_t *ref_buffer = ref_pyramid->layers[0].buffer;
  assert(ref_pyramid->layers[0].width == src_width);
  assert(ref_pyramid->layers[0].height == src_height);
  const int ref_stride = ref_pyramid->layers[0].stride;

  // find correspondences between the two images
  correspondences = (Correspondence *)aom_malloc(src_corners->num_corners *
                                                 sizeof(*correspondences));
  if (!correspondences) {
    *mem_alloc_failed = true;
    return false;
  }
  num_correspondences = determine_correspondence(
      src_buffer, src_corners->corners, src_corners->num_corners, ref_buffer,
      ref_corners->corners, ref_corners->num_corners, src_width, src_height,
      src_stride, ref_stride, correspondences);

  bool result = ransac(correspondences, num_correspondences, type,
                       motion_models, num_motion_models, mem_alloc_failed);

  aom_free(correspondences);
  return result;
}